

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIEnvironment::removeFont(CGUIEnvironment *this,IGUIFont *font)

{
  u32 uVar1;
  SFont *pSVar2;
  IGUIFont *in_RSI;
  array<irr::gui::CGUIEnvironment::SFont> *in_RDI;
  array<irr::gui::CGUIEnvironment::SFont> *unaff_retaddr;
  u32 i;
  undefined4 in_stack_ffffffffffffffd8;
  uint index;
  uint local_14;
  array<irr::gui::CGUIEnvironment::SFont> *paVar3;
  
  if (in_RSI != (IGUIFont *)0x0) {
    local_14 = 0;
    paVar3 = in_RDI;
    while (index = local_14,
          uVar1 = core::array<irr::gui::CGUIEnvironment::SFont>::size
                            ((array<irr::gui::CGUIEnvironment::SFont> *)0x3af1d6), index < uVar1) {
      pSVar2 = core::array<irr::gui::CGUIEnvironment::SFont>::operator[](in_RDI,index);
      uVar1 = (u32)((ulong)paVar3 >> 0x20);
      if (pSVar2->Font == in_RSI) {
        core::array<irr::gui::CGUIEnvironment::SFont>::operator[](in_RDI,index);
        IReferenceCounted::drop((IReferenceCounted *)CONCAT44(index,in_stack_ffffffffffffffd8));
        core::array<irr::gui::CGUIEnvironment::SFont>::erase(unaff_retaddr,uVar1);
        return;
      }
      local_14 = local_14 + 1;
    }
  }
  return;
}

Assistant:

void CGUIEnvironment::removeFont(IGUIFont *font)
{
	if (!font)
		return;
	for (u32 i = 0; i < Fonts.size(); ++i) {
		if (Fonts[i].Font == font) {
			Fonts[i].Font->drop();
			Fonts.erase(i);
			return;
		}
	}
}